

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

void __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
          (PersistentStorageJson *this,string *aFileName)

{
  allocator local_39;
  string local_38;
  
  (this->super_PersistentStorage)._vptr_PersistentStorage =
       (_func_int **)&PTR__PersistentStorageJson_00348318;
  std::__cxx11::string::string((string *)&this->mFileName,(string *)aFileName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&this->mCache,(nullptr_t)0x0);
  (this->mStorageLock).mPlatform = (sem_t *)0x0;
  std::__cxx11::string::string((string *)&local_38,"thrcomm_json_storage",&local_39);
  ot::os::semaphore::SemaphoreOpen(&local_38,&this->mStorageLock);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

PersistentStorageJson::PersistentStorageJson(std::string const &aFileName)
    : mFileName(aFileName)
    , mStorageLock()
{
    SemaphoreOpen("thrcomm_json_storage", mStorageLock);
}